

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decomposition.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  reference piVar1;
  vector<bool,_std::allocator<bool>_> *this;
  ostream *this_00;
  ostream *__x;
  ostream *this_01;
  CoordinateVector ghosts;
  BoolVector wrap;
  BoolVector share_face;
  int rank;
  Bounds domain;
  ContiguousAssigner assigner;
  int nblocks;
  int size;
  value_type_conflict *in_stack_fffffffffffffda8;
  Bounds<int> *in_stack_fffffffffffffdb0;
  _func_void_int_Bounds<int>_ptr_Bounds<int>_ptr_Bounds<int>_ptr_Link_ptr *in_stack_fffffffffffffdb8
  ;
  Bounds<int> *in_stack_fffffffffffffdc0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe68;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe70;
  int local_b8;
  BoolVector *in_stack_ffffffffffffff90;
  Creator *in_stack_ffffffffffffff98;
  StaticAssigner *in_stack_ffffffffffffffa0;
  Bounds<int> *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  BoolVector *in_stack_ffffffffffffffc0;
  CoordinateVector *in_stack_ffffffffffffffc8;
  DivisionsVector *in_stack_ffffffffffffffd0;
  
  diy::ContiguousAssigner::Assigner
            ((ContiguousAssigner *)in_stack_fffffffffffffdb0,
             (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),(int)in_stack_fffffffffffffda8);
  diy::Bounds<int>::Bounds
            (in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)in_stack_fffffffffffffdb0
                      ,(size_type)in_stack_fffffffffffffda8);
  *piVar1 = 0;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)in_stack_fffffffffffffdb0
                      ,(size_type)in_stack_fffffffffffffda8);
  *piVar1 = 0;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)in_stack_fffffffffffffdb0
                      ,(size_type)in_stack_fffffffffffffda8);
  *piVar1 = 0;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)in_stack_fffffffffffffdb0
                      ,(size_type)in_stack_fffffffffffffda8);
  *piVar1 = 0xff;
  this = (vector<bool,_std::allocator<bool>_> *)
         itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                   ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                    (size_type)in_stack_fffffffffffffda8);
  *(int *)&(this->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p = 0xff;
  piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                     ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)in_stack_fffffffffffffdb0
                      ,(size_type)in_stack_fffffffffffffda8);
  *piVar1 = 0xff;
  for (local_b8 = 0; local_b8 < 8; local_b8 = local_b8 + 1) {
    this_00 = std::operator<<((ostream *)&std::cout,"Rank ");
    __x = (ostream *)std::ostream::operator<<(this_00,local_b8);
    this_01 = std::operator<<(__x,":");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x10b7d6);
    std::vector<bool,_std::allocator<bool>_>::push_back(this,SUB81((ulong)piVar1 >> 0x38,0));
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x10b7f9);
    std::vector<bool,_std::allocator<bool>_>::push_back(this,SUB81((ulong)piVar1 >> 0x38,0));
    std::vector<bool,_std::allocator<bool>_>::push_back(this,SUB81((ulong)piVar1 >> 0x38,0));
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10b830);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
               in_stack_fffffffffffffda8);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
               in_stack_fffffffffffffda8);
    std::
    function<void(int,diy::Bounds<int>,diy::Bounds<int>,diy::Bounds<int>,diy::RegularLink<diy::Bounds<int>>)>
    ::
    function<void(&)(int,diy::Bounds<int>const&,diy::Bounds<int>const&,diy::Bounds<int>const&,diy::Link_const&),void>
              ((function<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>)>
                *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)this_00,(vector<int,_std::allocator<int>_> *)__x
              );
    local_1c8 = 0;
    uStack_1c0 = 0;
    local_1b8 = 0;
    in_stack_fffffffffffffdb8 =
         (_func_void_int_Bounds<int>_ptr_Bounds<int>_ptr_Bounds<int>_ptr_Link_ptr *)&local_1c8;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10b8fe);
    in_stack_fffffffffffffdb0 = (Bounds<int> *)&stack0xfffffffffffffe50;
    in_stack_fffffffffffffda8 = (value_type_conflict *)&stack0xfffffffffffffe68;
    diy::decompose<diy::Bounds<int>>
              (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x10b978);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x10b985);
    std::
    function<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>)>
    ::~function((function<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>)>
                 *)0x10b992);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x10b9ac);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x10b9b9);
  }
  diy::Bounds<int>::~Bounds(in_stack_fffffffffffffdb0);
  diy::ContiguousAssigner::~ContiguousAssigner((ContiguousAssigner *)0x10bb26);
  return 0;
}

Assistant:

int main(int, char* [])
{
  int                       size    = 8;
  int                       nblocks = 32;
  diy::ContiguousAssigner   assigner(size, nblocks);
  //diy::RoundRobinAssigner   assigner(size, nblocks);

  Bounds domain(3);
  domain.min[0] = domain.min[1] = domain.min[2] = 0;
  domain.max[0] = domain.max[1] = domain.max[2] = 255;
  //domain.max[0] = domain.max[1] = domain.max[2] = 128;

  for (int rank = 0; rank < size; ++ rank)
  {
    std::cout << "Rank " << rank << ":" << std::endl;

    // share_face is an n-dim (size 3 in this example) vector of bools
    // indicating whether faces are shared in each dimension
    // uninitialized values default to false
    diy::RegularDecomposer<Bounds>::BoolVector          share_face;
    share_face.push_back(true);

    // wrap is an n-dim (size 3 in this example) vector of bools
    // indicating whether boundary conditions are periodic in each dimension
    // uninitialized values default to false
    diy::RegularDecomposer<Bounds>::BoolVector          wrap;
    wrap.push_back(true);
    wrap.push_back(true);

    // ghosts is an n-dim (size 3 in this example) vector of ints
    // indicating number of ghost cells per side in each dimension
    // uninitialized values default to 0
    diy::RegularDecomposer<Bounds>::CoordinateVector    ghosts;
    ghosts.push_back(1); ghosts.push_back(2);

    diy::decompose(3, rank, domain, assigner, create, share_face, wrap, ghosts);
  }
}